

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

FaceData * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
tryInsert(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
          *this,ReductionKey *key,FaceData *value,size_t *newMemUsed)

{
  Entry *pEVar1;
  FaceData *pFVar2;
  Entry *pEVar3;
  ulong uVar4;
  uint uVar5;
  
  pEVar3 = lockEntriesAndGrowIfNeeded(this,newMemUsed);
  uVar4 = key->_val & 0xffffffff;
  do {
    uVar5 = (uint)uVar4 & this->_numEntries - 1;
    pEVar1 = pEVar3 + uVar5;
    if (pEVar3[uVar5].value == (FaceData *)0x0) {
      pEVar1->value = value;
      this->_size = this->_size + 1;
      (pEVar1->key)._val = key->_val;
      break;
    }
    do {
    } while ((pEVar1->key)._val == -1);
    uVar4 = (ulong)((uint)uVar4 + 1);
  } while ((pEVar1->key)._val != key->_val);
  pFVar2 = pEVar1->value;
  this->_entries = pEVar3;
  return pFVar2;
}

Assistant:

Value tryInsert(Key& key, Value value, size_t& newMemUsed)
    {
        Entry* entries = lockEntriesAndGrowIfNeeded(newMemUsed);
        uint32_t mask = _numEntries-1;
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.value == 0) {
                e.value = value;
                ++_size;
                PtexMemoryFence();
                e.key.copy(key);
                result = e.value;
                break;
            }
            while (e.key.isEmpty()) ;
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
        }
        unlockEntries(entries);
        return result;
    }